

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mon-make.c
# Opt level: O0

int16_t place_monster(chunk *c,loc_conflict grid,monster *mon,uint8_t origin)

{
  bool loading_00;
  _Bool _Var1;
  monster *pmVar2;
  monster *pmVar3;
  _Bool loading;
  monster_group_info *info;
  monster *new_mon;
  int16_t m_idx;
  uint8_t origin_local;
  monster *mon_local;
  chunk *c_local;
  loc_conflict grid_local;
  
  loading_00 = L'\0' < mon->midx;
  _Var1 = square_in_bounds(c,grid);
  if (!_Var1) {
    __assert_fail("square_in_bounds(c, grid)",
                  "/workspace/llm4binary/github/license_c_cmakelists/angband[P]angband/src/mon-make.c"
                  ,0x3ef,
                  "int16_t place_monster(struct chunk *, struct loc, struct monster *, uint8_t)");
  }
  pmVar2 = square_monster(c,grid);
  if (pmVar2 != (monster *)0x0) {
    __assert_fail("!square_monster(c, grid)",
                  "/workspace/llm4binary/github/license_c_cmakelists/angband[P]angband/src/mon-make.c"
                  ,0x3f0,
                  "int16_t place_monster(struct chunk *, struct loc, struct monster *, uint8_t)");
  }
  if (loading_00) {
    new_mon._4_2_ = (short)mon->midx;
    c->mon_max = c->mon_max + 1;
    c->mon_cnt = c->mon_cnt + 1;
  }
  else {
    new_mon._4_2_ = mon_pop(c);
    if (new_mon._4_2_ == 0) {
      return 0;
    }
  }
  pmVar2 = (monster *)cave_monster((chunk_conflict *)c,(int)new_mon._4_2_);
  memcpy(pmVar2,mon,0x1a0);
  pmVar2->midx = (int)new_mon._4_2_;
  square_set_mon(c,grid,pmVar2->midx);
  pmVar2->grid = grid;
  pmVar3 = square_monster(c,grid);
  if (pmVar3 == pmVar2) {
    monster_group_assign(c,pmVar2,mon->group_info,loading_00);
    update_mon(pmVar2,c,true);
    _Var1 = flag_has_dbg(pmVar2->race->flags,0xb,0x11,"new_mon->race->flags","RF_MULTIPLY");
    if (_Var1) {
      c->num_repro = c->num_repro + L'\x01';
    }
    if (pmVar2->original_race == (monster_race *)0x0) {
      pmVar2->race->cur_num = pmVar2->race->cur_num + L'\x01';
    }
    else {
      pmVar2->original_race->cur_num = pmVar2->original_race->cur_num + L'\x01';
    }
    if ((origin != '\0') &&
       (mon_create_drop(c,pmVar2,origin), pmVar2->race->mimic_kinds != (monster_mimic *)0x0)) {
      mon_create_mimicked_object(c,pmVar2,(int)new_mon._4_2_);
    }
    return new_mon._4_2_;
  }
  __assert_fail("square_monster(c, grid) == new_mon",
                "/workspace/llm4binary/github/license_c_cmakelists/angband[P]angband/src/mon-make.c"
                ,0x406,
                "int16_t place_monster(struct chunk *, struct loc, struct monster *, uint8_t)");
}

Assistant:

int16_t place_monster(struct chunk *c, struct loc grid, struct monster *mon,
		uint8_t origin)
{
	int16_t m_idx;
	struct monster *new_mon;
	struct monster_group_info *info = mon->group_info;
	bool loading = mon->midx > 0;

	assert(square_in_bounds(c, grid));
	assert(!square_monster(c, grid));

	/* Get a new record, or recycle the old one */
	if (loading) {
		m_idx = mon->midx;
		c->mon_max++;
		c->mon_cnt++;
	} else {
		m_idx = mon_pop(c);
		if (!m_idx) return 0;
	}

	/* Copy the monster */
	new_mon = cave_monster(c, m_idx);
	memcpy(new_mon, mon, sizeof(struct monster));

	/* Set the ID */
	new_mon->midx = m_idx;

	/* Set the location */
	square_set_mon(c, grid, new_mon->midx);
	new_mon->grid = grid;
	assert(square_monster(c, grid) == new_mon);

	/* Assign monster to its monster group */
	monster_group_assign(c, new_mon, info, loading);

	update_mon(new_mon, c, true);

	/* Count the number of "reproducers" */
	if (rf_has(new_mon->race->flags, RF_MULTIPLY)) c->num_repro++;

	/* Count racial occurrences */
	if (new_mon->original_race) new_mon->original_race->cur_num++;
	else new_mon->race->cur_num++;

	/* Create the monster's drop, if any */
	if (origin)
		(void)mon_create_drop(c, new_mon, origin);

	/* Make mimics start mimicking */
	if (origin && new_mon->race->mimic_kinds) {
		mon_create_mimicked_object(c, new_mon, m_idx);
	}

	/* Result */
	return m_idx;
}